

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::PopFuncInfo(ByteCodeGenerator *this,char16 *location)

{
  bool bVar1;
  FuncInfo *pFVar2;
  
  pFVar2 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Pop(this->funcInfoStack);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
  if (bVar1) {
    Output::Print(L"%s: PopFuncInfo: %s",location,pFVar2->name);
    pFVar2 = TopFuncInfo(this);
    if (pFVar2 != (FuncInfo *)0x0) {
      pFVar2 = TopFuncInfo(this);
      Output::Print(L" Top: %s",pFVar2->name);
    }
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void ByteCodeGenerator::PopFuncInfo(char16 const * location)
{
    FuncInfo * funcInfo = funcInfoStack->Pop();
    // Assert(!funcInfo->IsGlobalFunction() || this->TopFuncInfo() == nullptr || this->TopFuncInfo()->IsGlobalFunction());
    if (PHASE_TRACE1(Js::ByteCodePhase))
    {
        Output::Print(_u("%s: PopFuncInfo: %s"), location, funcInfo->name);
        if (this->TopFuncInfo())
        {
            Output::Print(_u(" Top: %s"), this->TopFuncInfo()->name);
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }
}